

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Float pbrt::SampleCatmullRom
                (span<const_float> x,span<const_float> f,span<const_float> F,Float u,Float *fval,
                Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  char *args;
  char *args_1;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar38 [64];
  size_t vb;
  size_t va;
  
  vb = F.n;
  pfVar21 = F.ptr;
  va = x.n;
  pfVar20 = x.ptr;
  uVar16 = f.n;
  pfVar19 = f.ptr;
  if (va == uVar16) {
    if (uVar16 == vb) {
      uVar16 = vb - 2;
      lVar18 = 1;
      uVar22 = uVar16;
      while (uVar15 = uVar22, 0 < (long)uVar15) {
        uVar22 = uVar15 >> 1;
        if (pfVar21[(int)uVar22 + (int)lVar18] <= u * pfVar21[vb - 1]) {
          lVar18 = uVar22 + 1 + lVar18;
          uVar22 = ~uVar22 + uVar15;
        }
      }
      if (lVar18 - 1U < uVar16) {
        uVar16 = lVar18 - 1U;
      }
      uVar22 = 0;
      if (0 < lVar18) {
        uVar22 = uVar16;
      }
      iVar23 = (int)uVar22;
      fVar1 = pfVar20[iVar23];
      lVar18 = (long)((uVar22 << 0x20) + 0x100000000) >> 0x1e;
      fVar33 = *(float *)((long)pfVar20 + lVar18);
      fVar2 = pfVar19[iVar23];
      fVar3 = *(float *)((long)pfVar19 + lVar18);
      fVar5 = fVar33 - fVar1;
      if (iVar23 < 1) {
        fVar33 = fVar3 - fVar2;
      }
      else {
        fVar33 = (fVar5 * (fVar3 - pfVar19[iVar23 - 1U])) / (fVar33 - pfVar20[iVar23 - 1U]);
      }
      uVar16 = (long)((uVar22 << 0x20) + 0x200000000) >> 0x20;
      if (uVar16 < va) {
        fVar35 = (fVar5 * (pfVar19[uVar16] - fVar2)) / (pfVar20[uVar16] - fVar1);
      }
      else {
        fVar35 = fVar3 - fVar2;
      }
      fVar34 = (u * pfVar21[vb - 1] - pfVar21[iVar23]) / fVar5;
      fVar4 = fVar33 * 0.5;
      auVar14 = vfmsub231ss_fma(ZEXT416((uint)fVar35),ZEXT416((uint)fVar33),ZEXT416(0xc0000000));
      auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eaaaaab),0),auVar14,ZEXT416((uint)fVar3));
      fVar6 = auVar12._0_4_ - fVar2;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)((fVar2 - fVar3) * 0.5)),
                                ZEXT416((uint)(fVar35 + fVar33)),ZEXT416(0x3e800000));
      auVar28 = ZEXT816(0) << 0x20;
      auVar12 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar13,ZEXT416((uint)fVar6));
      auVar12 = vfmadd213ss_fma(auVar12,auVar28,ZEXT416((uint)fVar4));
      auVar32 = ZEXT416((uint)fVar2);
      auVar12 = vfmadd213ss_fma(auVar12,auVar28,auVar32);
      auVar27 = vfmadd213ss_fma(auVar12,auVar28,auVar28);
      auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar3 - fVar2)),auVar14,ZEXT416(0x40400000));
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar35 + fVar33)),ZEXT416((uint)(fVar2 - fVar3)),
                                ZEXT416(0x40000000));
      fVar3 = auVar27._0_4_ - fVar34;
      auVar27 = ZEXT416((uint)(auVar14._0_4_ + auVar12._0_4_ + fVar33 + fVar2));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx512vl(ZEXT416((uint)fVar3),auVar25);
      if (1e-06 <= auVar25._0_4_) {
        fVar2 = (auVar13._0_4_ + fVar6 + fVar4 + fVar2 + 0.0) - fVar34;
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx512vl(ZEXT416((uint)fVar2),auVar28);
        if (1e-06 <= auVar25._0_4_) {
          auVar36 = ZEXT816(0);
          auVar25 = vsubss_avx512f(auVar36,ZEXT416((uint)(fVar3 / (fVar2 - fVar3))));
          auVar38 = ZEXT464(0x3f800000);
          uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar3),auVar36,1);
          auVar37._8_4_ = 0x7fffffff;
          auVar37._0_8_ = 0x7fffffff7fffffff;
          auVar37._12_4_ = 0x7fffffff;
          auVar26 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          do {
            auVar27 = vaddss_avx512f(auVar38._0_16_,auVar26);
            fVar2 = auVar27._0_4_ * 0.5;
            uVar9 = vcmpss_avx512f(auVar25,auVar38._0_16_,1);
            bVar17 = (bool)((byte)uVar9 & 1);
            uVar9 = vcmpss_avx512f(auVar26,auVar25,1);
            bVar10 = (bool)((byte)uVar9 & 1);
            uVar24 = (uint)bVar10 * ((uint)bVar17 * auVar25._0_4_ + (uint)!bVar17 * (int)fVar2) +
                     (uint)!bVar10 * (int)fVar2;
            auVar25 = ZEXT416(uVar24);
            auVar27 = vfmadd213ss_avx512f(auVar13,auVar25,ZEXT416((uint)fVar6));
            auVar27 = vfmadd213ss_avx512f(auVar27,auVar25,ZEXT416((uint)fVar4));
            auVar27 = vfmadd213ss_avx512f(auVar27,auVar25,auVar32);
            auVar28 = vfmadd213ss_avx512f(auVar27,auVar25,auVar36);
            auVar27 = vfmadd213ss_fma(auVar14,auVar25,auVar12);
            auVar27 = vfmadd213ss_fma(auVar27,auVar25,ZEXT416((uint)fVar33));
            auVar27 = vfmadd213ss_fma(auVar27,auVar25,auVar32);
            auVar28 = vsubss_avx512f(auVar28,ZEXT416((uint)fVar34));
            uVar9 = vcmpps_avx512vl(auVar28,auVar36,5);
            bVar11 = (byte)uVar7 ^ (byte)uVar9;
            auVar29 = ZEXT416((uint)(bVar11 & 1) * auVar38._0_4_ + !(bool)(bVar11 & 1) * uVar24);
            auVar26._0_4_ = (bVar11 & 1) * uVar24 + (uint)!(bool)(bVar11 & 1) * auVar26._0_4_;
            auVar30 = vsubss_avx512f(auVar29,auVar26);
            auVar31 = vandps_avx512vl(auVar28,auVar37);
            uVar9 = vcmpps_avx512vl(auVar31,SUB6416(ZEXT464(0x358637bd),0),5);
            uVar8 = vcmpps_avx512vl(auVar30,SUB6416(ZEXT464(0x358637bd),0),5);
            bVar17 = (bool)((byte)uVar9 & (byte)uVar8 & 1);
            auVar28 = vdivss_avx512f(auVar28,auVar27);
            auVar25 = vsubss_avx512f(auVar25,auVar28);
            auVar25 = ZEXT416((uint)bVar17 * auVar25._0_4_ + !bVar17 * uVar24);
            auVar28 = ZEXT416((uint)bVar17 * in_ZMM17._0_4_ + !bVar17 * uVar24);
            auVar38 = ZEXT1664(auVar29);
            in_ZMM17 = ZEXT1664(auVar28);
          } while (bVar17 != false);
        }
        else {
          auVar28 = SUB6416(ZEXT464(0x3f800000),0);
        }
      }
      if (fval != (Float *)0x0) {
        *fval = auVar27._0_4_;
      }
      if (pdf != (Float *)0x0) {
        *pdf = auVar27._0_4_ / pfVar21[vb - 1];
      }
      auVar12 = vfmadd213ss_fma(auVar28,ZEXT416((uint)fVar5),ZEXT416((uint)fVar1));
      return auVar12._0_4_;
    }
    args_1 = "F.size()";
    args = "f.size()";
    iVar23 = 0x18d;
    va = uVar16;
  }
  else {
    args_1 = "f.size()";
    args = "x.size()";
    iVar23 = 0x18c;
    vb = uVar16;
  }
  LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
             ,iVar23,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])args,
             (char (*) [9])args_1,(char (*) [9])args,&va,(char (*) [9])args_1,&vb);
}

Assistant:

Float SampleCatmullRom(pstd::span<const Float> x, pstd::span<const Float> f,
                       pstd::span<const Float> F, Float u, Float *fval, Float *pdf) {
    CHECK_EQ(x.size(), f.size());
    CHECK_EQ(f.size(), F.size());
    // Map _u_ to a spline interval by inverting _F_
    u *= F.back();
    int i = FindInterval(F.size(), [&](int i) { return F[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - f[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (f[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    // Re-scale _u_ for continous spline sampling step
    u = (u - F[i]) / width;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / F.back();
    return x0 + width * t;
}